

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createRealloc(LLVMPointerGraphBuilder *this,CallInst *CInst)

{
  PSNodeAlloc *this_00;
  PSNode *r;
  uint64_t s;
  CallInst *in_RDX;
  PSNode *in_RSI;
  PSNode *in_RDI;
  PSNode *ptr;
  PSNode *mcp;
  PSNodeAlloc *reall;
  PSNode *orig_mem;
  PSNodesSeq *ret;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffa8;
  SubgraphNode<dg::pta::PSNode> *this_01;
  PSNode *this_02;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  PointerGraph *in_stack_ffffffffffffffc0;
  
  this_02 = in_RDI;
  PSNodesSeq::PSNodesSeq((PSNodesSeq *)in_RSI);
  llvm::CallBase::getOperand((CallBase *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  getOperand(in_stack_ffffffffffffffa8,(Value *)in_RSI);
  PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)in_RSI);
  this_00 = PSNodeAlloc::get<dg::pta::PSNode>(in_RSI);
  PSNodeAlloc::setIsHeap(this_00);
  SubgraphNode<dg::pta::PSNode>::setUserData<llvm::CallInst>
            (&(this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>,in_RDX);
  PointerGraph::
  create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
            (in_stack_ffffffffffffffc0,
             (PSNode **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (PSNodeAlloc **)this_02,(unsigned_long *)in_stack_ffffffffffffffa8);
  r = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNodeAlloc*&,int>
                ((PointerGraph *)this_02,(PSNodeAlloc **)in_stack_ffffffffffffffa8,(int *)in_RSI);
  PSNodeAlloc::setIsHeap(this_00);
  this_01 = &(this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>;
  llvm::CallBase::getOperand((CallBase *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  s = llvmutils::getConstantSizeValue((Value *)in_RDI);
  SubgraphNode<dg::pta::PSNode>::setSize(this_01,s);
  PSNodesSeq::append((PSNodesSeq *)in_RSI,in_RDI);
  PSNodesSeq::append((PSNodesSeq *)in_RSI,in_RDI);
  PSNodesSeq::append((PSNodesSeq *)in_RSI,in_RDI);
  PSNodesSeq::setRepresentant((PSNodesSeq *)this_02,r);
  return (PSNodesSeq *)in_RDI;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createRealloc(const llvm::CallInst *CInst) {
    using namespace llvm;

    PSNodesSeq ret;

    // we create new allocation node and memcpy old pointers there
    PSNode *orig_mem = getOperand(CInst->getOperand(0));
    PSNodeAlloc *reall = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    reall->setIsHeap();
    reall->setUserData(const_cast<llvm::CallInst *>(CInst));

    // copy everything that is in orig_mem to reall
    PSNode *mcp =
            PS.create<PSNodeType::MEMCPY>(orig_mem, reall, Offset::UNKNOWN);
    // we need the pointer in the last node that we return
    PSNode *ptr = PS.create<PSNodeType::CONSTANT>(reall, 0);

    reall->setIsHeap();
    reall->setSize(llvmutils::getConstantSizeValue(CInst->getOperand(1)));

    ret.append(reall);
    ret.append(mcp);
    ret.append(ptr);
    ret.setRepresentant(ptr);

    return ret;
}